

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmw<unsigned_int,unsigned_int>
          (Thread *this,BinopFunc<unsigned_int,_unsigned_int> *f,Instr instr,Ptr *out_trap)

{
  Store *this_00;
  uint rhs;
  uint uVar1;
  Result RVar2;
  unsigned_long offset;
  RunResult RVar3;
  uint local_8c;
  BinopFunc<unsigned_int,_unsigned_int> *local_88;
  RefPtr<wabt::interp::Memory> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  local_88 = f;
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  rhs = Pop<unsigned_int>(this);
  if (((local_80.obj_)->type_).limits.is_64 == true) {
    offset = Pop<unsigned_long>(this);
  }
  else {
    uVar1 = Pop<unsigned_int>(this);
    offset = (unsigned_long)uVar1;
  }
  RVar2 = Memory::AtomicRmw<unsigned_int,unsigned_int(*&)(unsigned_int,unsigned_int)>
                    (local_80.obj_,offset,(ulong)instr.field_2.imm_u32x2.snd,rhs,&local_88,&local_8c
                    );
  if (RVar2.enum_ == Error) {
    this_00 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_68,"invalid atomic access at %lu+%u",offset,(ulong)instr.field_2.imm_u32x2.snd
              );
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    RVar3 = Trap;
  }
  else {
    Push<unsigned_int>(this,local_8c);
    RVar3 = Ok;
  }
  if (local_80.obj_ != (Memory *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_80.store_)->roots_,local_80.root_index_);
  }
  return RVar3;
}

Assistant:

RunResult Thread::DoAtomicRmw(BinopFunc<T, T> f,
                              Instr instr,
                              Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  T val = static_cast<T>(Pop<R>());
  u64 offset = PopPtr(memory);
  T old;
  TRAP_IF(Failed(memory->AtomicRmw(offset, instr.imm_u32x2.snd, val, f, &old)),
          StringPrintf("invalid atomic access at %" PRIaddress "+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<R>(old));
  return RunResult::Ok;
}